

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O0

void __thiscall
dtc::text_input_buffer::text_input_buffer
          (text_input_buffer *this,
          unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *b,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *d,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *i,string *directory,FILE *deps)

{
  shared_ptr<dtc::input_buffer> local_58 [2];
  FILE *local_38;
  FILE *deps_local;
  string *directory_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *i_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *d_local;
  unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *b_local;
  text_input_buffer *this_local;
  
  local_38 = deps;
  deps_local = (FILE *)directory;
  directory_local = (string *)i;
  i_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)d;
  d_local = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)b;
  b_local = (unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *)this;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->defines,d);
  this->cursor = 0;
  std::
  stack<std::shared_ptr<dtc::input_buffer>,std::deque<std::shared_ptr<dtc::input_buffer>,std::allocator<std::shared_ptr<dtc::input_buffer>>>>
  ::
  stack<std::deque<std::shared_ptr<dtc::input_buffer>,std::allocator<std::shared_ptr<dtc::input_buffer>>>,void>
            ((stack<std::shared_ptr<dtc::input_buffer>,std::deque<std::shared_ptr<dtc::input_buffer>,std::allocator<std::shared_ptr<dtc::input_buffer>>>>
              *)&this->input_stack);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->include_paths,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)directory_local);
  std::__cxx11::string::string((string *)&this->dir,(string *)directory);
  this->depfile = local_38;
  std::shared_ptr<dtc::input_buffer>::
  shared_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>,void>
            (local_58,(unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *)
                      d_local);
  std::
  stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
  ::push(&this->input_stack,local_58);
  std::shared_ptr<dtc::input_buffer>::~shared_ptr(local_58);
  return;
}

Assistant:

text_input_buffer(std::unique_ptr<input_buffer> &&b,
	                  std::unordered_set<std::string> &&d,
	                  std::vector<std::string> &&i,
	                  const std::string directory,
	                  FILE *deps)
		: defines(d), include_paths(i), dir(directory), depfile(deps)
	{
		input_stack.push(std::move(b));
	}